

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnAtomicWaitExpr
          (ExprVisitorDelegate *this,AtomicWaitExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  Info local_50;
  
  if (*(int *)&expr->field_0x38 == 4) {
    this_00 = this->writer_;
    Opcode::GetInfo(&local_50,&expr->opcode);
    WritePuts(this_00,local_50.name,Space);
    if (expr->offset != 0) {
      Writef(this_00,"offset=%u");
    }
    bVar1 = Opcode::IsNaturallyAligned(&expr->opcode,expr->align);
    if (!bVar1) {
      Writef(this_00,"align=%u",(ulong)expr->align);
    }
    if (this_00->next_char_ == ForceNewline) {
      WriteNextChar(this_00);
    }
    this_00->next_char_ = Newline;
    return (Result)Ok;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                ,0x48,
                "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::AtomicWait>, Base = wabt::Expr]"
               );
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnAtomicWaitExpr(AtomicWaitExpr* expr) {
  writer_->WriteLoadStoreExpr<AtomicWaitExpr>(expr);
  return Result::Ok;
}